

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,IndexAccessor *i_accessor,void *data)

{
  SyntaxTree *pSVar1;
  ExpVarData exp_var_data;
  undefined8 local_24;
  undefined1 local_1c;
  
  i_accessor->semantic_ = *data;
  local_24 = 1;
  local_1c = 0;
  pSVar1 = (i_accessor->table_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_24);
  pSVar1 = (i_accessor->index_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_24);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(IndexAccessor *i_accessor, void *data)
    {
        // Set this IndexAccessor semantic from parent's semantic data
        i_accessor->semantic_ = static_cast<ExpVarData *>(data)->semantic_op_;

        // table_ and index_ expressions are read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        i_accessor->table_->Accept(this, &exp_var_data);
        i_accessor->index_->Accept(this, &exp_var_data);
    }